

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::missing_argument_exception::~missing_argument_exception(missing_argument_exception *this)

{
  missing_argument_exception *this_local;
  
  ~missing_argument_exception(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

missing_argument_exception(const std::string& option)
    : OptionParseException(
        "Option " + LQUOTE + option + RQUOTE + " is missing an argument"
      )
    {
    }